

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACard.cpp
# Opt level: O2

void __thiscall ACard::ACard(ACard *this,EventHandler *e)

{
  this->_vptr_ACard = (_func_int **)&PTR___cxa_pure_virtual_00107c18;
  (this->_name)._M_dataplus._M_p = (pointer)&(this->_name).field_2;
  (this->_name)._M_string_length = 0;
  (this->_name).field_2._M_local_buf[0] = '\0';
  (this->_description)._M_dataplus._M_p = (pointer)&(this->_description).field_2;
  (this->_description)._M_string_length = 0;
  (this->_description).field_2._M_local_buf[0] = '\0';
  (this->_event)._event.
  super__Vector_base<std::function<int_()>,_std::allocator<std::function<int_()>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_event)._event.
  super__Vector_base<std::function<int_()>,_std::allocator<std::function<int_()>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_event)._event.
  super__Vector_base<std::function<int_()>,_std::allocator<std::function<int_()>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::function<int_()>,_std::allocator<std::function<int_()>_>_>::operator=
            (&(this->_event)._event,&e->_event);
  return;
}

Assistant:

ACard::ACard(EventHandler e) {
    ACard::_event = e;
}